

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void sarimax_exec(sarimax_object obj,double *inp,double *xreg)

{
  int q;
  int d;
  int N;
  int P;
  int D;
  int Q;
  int s;
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  double dVar13;
  double dVar14;
  int cssml;
  int start;
  int imean;
  sarimax_object local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  
  iVar1 = obj->p;
  lVar5 = (long)iVar1;
  q = obj->q;
  lVar7 = (long)q;
  d = obj->d;
  lVar6 = (long)d;
  N = obj->N;
  lVar2 = (long)N;
  P = obj->P;
  lVar10 = (long)P;
  D = obj->D;
  Q = obj->Q;
  lVar8 = (long)Q;
  iVar3 = obj->method;
  s = obj->s;
  lVar4 = (long)obj->M;
  if (iVar3 == 2) {
    piVar9 = &obj[1].N + lVar5 * 2;
    piVar11 = piVar9 + lVar7 * 2;
    piVar12 = piVar11 + lVar10 * 2;
    iVar1 = cssx(inp,N,xreg,obj->optmethod,iVar1,d,q,s,P,D,Q,(double *)(obj + 1),(double *)piVar9,
                 (double *)piVar11,(double *)piVar12,(double *)(piVar12 + lVar8 * 2),obj->r,
                 &obj->mean,&obj->var,&obj->loglik,
                 (double *)(piVar12 + lVar8 * 2 + (lVar4 + lVar2 + (-lVar6 - (long)(s * D))) * 2),
                 obj->start,obj->imean);
    obj->retval = iVar1;
    obj->loglik = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5
    ;
  }
  else {
    if (iVar3 == 1) {
      local_68 = &obj[1].N + lVar5 * 2;
      local_60 = local_68 + lVar7 * 2;
      local_58 = local_60 + lVar10 * 2;
      piVar11 = local_58 + lVar8 * 2;
      iVar3 = obj->optmethod;
      local_50 = obj->r;
      piVar12 = piVar11 + lVar4 * 2;
      piVar9 = piVar12 + (lVar2 + (-lVar6 - (long)(s * D))) * 2;
      start = obj->start;
      imean = obj->imean;
      cssml = 0;
    }
    else {
      if (iVar3 != 0) {
        puts(
            "Only three methods are supported : 0 , 1 and 2 , where 0 is CSS-MLE ,1 is MLE and 2 is CSS "
            );
        exit(-1);
      }
      local_68 = &obj[1].N + lVar5 * 2;
      local_60 = local_68 + lVar7 * 2;
      local_58 = local_60 + lVar10 * 2;
      piVar11 = local_58 + lVar8 * 2;
      iVar3 = obj->optmethod;
      local_50 = obj->r;
      piVar12 = piVar11 + lVar4 * 2;
      piVar9 = piVar12 + (lVar2 + (-lVar6 - (long)(s * D))) * 2;
      start = obj->start;
      imean = obj->imean;
      cssml = 1;
    }
    local_38 = &obj->loglik;
    local_40 = &obj->var;
    local_48 = &obj->mean;
    local_70 = obj + 1;
    iVar1 = as154x(inp,N,xreg,iVar3,iVar1,d,q,s,P,D,Q,(double *)local_70,(double *)local_68,
                   (double *)local_60,(double *)local_58,(double *)piVar11,local_50,local_48,
                   local_40,(double *)piVar12,local_38,(double *)piVar9,cssml,start,imean);
    obj->retval = iVar1;
    dVar14 = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5;
    obj->loglik = dVar14;
    dVar13 = (double)(obj->q + obj->p + obj->P + obj->Q + obj->M);
    obj->aic = ((dVar13 + dVar13) - (dVar14 + dVar14)) + 2.0;
  }
  return;
}

Assistant:

void sarimax_exec(sarimax_object obj, double *inp,double *xreg)  {
	int p,q,d,N,M,P,D,Q,s,r,nd,ncxreg,cssml;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;
	P = obj->P;
	D = obj->D;
	Q = obj->Q;
	s = obj->s;
	r = obj->r;

	M = obj->M;

	if (obj->method == 0) {
		cssml = 1;
		obj->retval = as154x(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,obj->params + p + q + P + Q + M,
			 &obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,cssml,obj->start,obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	} else if (obj->method == 1) {
		cssml = 0;
		obj->retval = as154x(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,obj->params + p + q + P + Q + M,
			 &obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,cssml,obj->start,obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	} else if (obj->method == 2) {
		obj->retval = cssx(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,&obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,obj->start,
			obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	} else {
		printf("Only three methods are supported : 0 , 1 and 2 , where 0 is CSS-MLE ,1 is MLE and 2 is CSS \n");
		exit(-1);
	}
}